

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O2

iterator __thiscall
QMap<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo>::insert
          (QMap<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo> *this,
          Operation *key,OperationInfo *value)

{
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo>_>,_bool>
  pVar1;
  QExplicitlySharedDataPointerV2<QMapData<std::map<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo,_std::less<QMdiSubWindowPrivate::Operation>,_std::allocator<std::pair<const_QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo>_>_>_>_>
  local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.d.ptr =
       (totally_ordered_wrapper<QMapData<std::map<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo,_std::less<QMdiSubWindowPrivate::Operation>,_std::allocator<std::pair<const_QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo>_>_>_>_*>
        )(this->d).d.ptr;
  if ((local_28.d.ptr ==
       (QMapData<std::map<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo,_std::less<QMdiSubWindowPrivate::Operation>,_std::allocator<std::pair<const_QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo>_>_>_>
        *)0x0) ||
     ((__atomic_base<int>)
      *(__int_type *)
       &(((QMapData<std::map<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo,_std::less<QMdiSubWindowPrivate::Operation>,_std::allocator<std::pair<const_QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo>_>_>_>
           *)local_28.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x1)) {
    local_28.d.ptr =
         (totally_ordered_wrapper<QMapData<std::map<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo,_std::less<QMdiSubWindowPrivate::Operation>,_std::allocator<std::pair<const_QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo>_>_>_>_*>
          )(QMapData<std::map<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo,_std::less<QMdiSubWindowPrivate::Operation>,_std::allocator<std::pair<const_QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo>_>_>_>
            *)0x0;
  }
  else {
    LOCK();
    (((QMapData<std::map<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo,_std::less<QMdiSubWindowPrivate::Operation>,_std::allocator<std::pair<const_QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo>_>_>_>
       *)local_28.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value =
         (Type)((int)(((QMapData<std::map<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo,_std::less<QMdiSubWindowPrivate::Operation>,_std::allocator<std::pair<const_QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo>_>_>_>
                        *)local_28.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
                     super_QBasicAtomicInteger<int>._q_value + 1);
    UNLOCK();
  }
  detach(this);
  pVar1 = std::
          map<QMdiSubWindowPrivate::Operation,QMdiSubWindowPrivate::OperationInfo,std::less<QMdiSubWindowPrivate::Operation>,std::allocator<std::pair<QMdiSubWindowPrivate::Operation_const,QMdiSubWindowPrivate::OperationInfo>>>
          ::insert_or_assign<QMdiSubWindowPrivate::OperationInfo_const&>
                    ((map<QMdiSubWindowPrivate::Operation,QMdiSubWindowPrivate::OperationInfo,std::less<QMdiSubWindowPrivate::Operation>,std::allocator<std::pair<QMdiSubWindowPrivate::Operation_const,QMdiSubWindowPrivate::OperationInfo>>>
                      *)&((this->d).d.ptr)->m,key,value);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo,_std::less<QMdiSubWindowPrivate::Operation>,_std::allocator<std::pair<const_QMdiSubWindowPrivate::Operation,_QMdiSubWindowPrivate::OperationInfo>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)(_Base_ptr)pVar1.first._M_node;
  }
  __stack_chk_fail();
}

Assistant:

iterator insert(const Key &key, const T &value)
    {
        const auto copy = d.isShared() ? *this : QMap(); // keep `key` alive across the detach
        // TODO: improve. In case of assignment, why copying first?
        detach();
        return iterator(d->m.insert_or_assign(key, value).first);
    }